

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall QListModeViewBase::verticalOffset(QListModeViewBase *this)

{
  Flow FVar1;
  ScrollMode SVar2;
  int iVar3;
  QScrollBar *pQVar4;
  long lVar5;
  QListViewPrivate *pQVar6;
  int *piVar7;
  
  SVar2 = QCommonListViewBase::verticalScrollMode(&this->super_QCommonListViewBase);
  if (SVar2 == ScrollPerItem) {
    pQVar6 = (this->super_QCommonListViewBase).dd;
    FVar1 = pQVar6->flow;
    if (pQVar6->wrap == true) {
      if ((FVar1 == LeftToRight) && ((this->segmentPositions).d.size != 0)) {
        pQVar4 = QCommonListViewBase::verticalScrollBar(&this->super_QCommonListViewBase);
        iVar3 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
        lVar5 = (long)iVar3;
        if ((this->segmentPositions).d.size <= lVar5) {
          return 0;
        }
        pQVar6 = (this->super_QCommonListViewBase).dd;
        piVar7 = (this->segmentPositions).d.ptr;
LAB_005174c0:
        return piVar7[lVar5] - pQVar6->space;
      }
    }
    else if ((FVar1 == TopToBottom) && ((this->flowPositions).d.size != 0)) {
      pQVar4 = QCommonListViewBase::verticalScrollBar(&this->super_QCommonListViewBase);
      iVar3 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
      if ((this->scrollValueMap).d.size < (long)iVar3) {
        return 0;
      }
      lVar5 = (long)(this->scrollValueMap).d.ptr[iVar3];
      pQVar6 = (this->super_QCommonListViewBase).dd;
      piVar7 = (this->flowPositions).d.ptr;
      goto LAB_005174c0;
    }
  }
  iVar3 = QCommonListViewBase::verticalOffset(&this->super_QCommonListViewBase);
  return iVar3;
}

Assistant:

int QListModeViewBase::verticalOffset() const
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        if (isWrapping()) {
            if (flow() == QListView::LeftToRight && !segmentPositions.isEmpty()) {
                int value = verticalScrollBar()->value();
                if (value >= segmentPositions.size())
                    return 0;
                return segmentPositions.at(value) - spacing();
            }
        } else if (flow() == QListView::TopToBottom && !flowPositions.isEmpty()) {
            int value = verticalScrollBar()->value();
            if (value > scrollValueMap.size())
                return 0;
            return flowPositions.at(scrollValueMap.at(value)) - spacing();
        }
    }
    return QCommonListViewBase::verticalOffset();
}